

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

ScriptBuilder * __thiscall cfd::core::ScriptBuilder::AppendData(ScriptBuilder *this,int64_t *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  ScriptElement element;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  ByteData local_88;
  ScriptElement local_70;
  
  ScriptElement::ScriptElement(&local_70,*data);
  ScriptElement::GetData(&local_88,&local_70);
  ByteData::GetBytes(&local_a0,&local_88);
  if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             &this->script_byte_array_);
  if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ScriptElement::~ScriptElement(&local_70);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendData(const int64_t& data) {
  ScriptElement element(data);
  std::vector<uint8_t> byte_datas = element.GetData().GetBytes();
  std::copy(
      byte_datas.begin(), byte_datas.end(),
      std::back_inserter(script_byte_array_));
  return *this;
}